

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O2

char * search_i(Item *items,size_t len,int key)

{
  Item *pIVar1;
  
  pIVar1 = items + len;
  while( true ) {
    if (pIVar1 <= items) {
      return (char *)0x0;
    }
    if (items->key == key) break;
    items = items + 1;
  }
  return items->value;
}

Assistant:

const char*
search_i(Item *items, size_t len, int key)
{
    Item *item;
    Item *end = items + len;
    for (item = items;item < end;item++) {
        if (item->key == key) {
            return item->value;
        }
    }
    return NULL;
}